

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

char * SoapySDRDevice_getTimeSource(SoapySDRDevice *device)

{
  undefined1 *puVar1;
  char *pcVar2;
  char *local_30 [4];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_00141f38);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x260))(local_30,device);
  pcVar2 = strdup(local_30[0]);
  std::__cxx11::string::~string((string *)local_30);
  return pcVar2;
}

Assistant:

char *SoapySDRDevice_getTimeSource(const SoapySDRDevice *device)
{
    __SOAPY_SDR_C_TRY
    return strdup(device->getTimeSource().c_str());
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}